

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::BuildVertexIndicesImpl
          (RenderSceneConverter *this,RenderMesh *mesh)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  VertexAttribute *this_00;
  unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
  *this_01;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer paVar5;
  pointer piVar6;
  pointer pfVar7;
  pointer paVar8;
  pointer pfVar9;
  pointer puVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  pointer paVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  size_t sVar18;
  ostream *poVar19;
  pointer puVar20;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var21;
  mapped_type *pmVar22;
  size_type sVar23;
  _Rb_tree_node_base *p_Var24;
  mapped_type *pmVar25;
  ulong uVar26;
  long lVar27;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar28;
  size_type __n;
  size_t i;
  char *pcVar29;
  unsigned_long *args_1;
  long lVar30;
  size_t k;
  __node_base *p_Var31;
  pointer piVar32;
  ulong uVar33;
  long lVar34;
  bool bVar35;
  _Hash_node_base *local_4a8;
  uint32_t orgPointIdx;
  _Rb_tree_node_base *local_498;
  unsigned_long *local_490;
  pointer local_488;
  VertexAttribute *local_480;
  vector<float,_std::allocator<float>_> tmp_weights;
  _Hash_node_base *local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmpPointIndices;
  size_t fvi;
  pointer paStack_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_408;
  pointer local_3e8;
  pointer local_3e0;
  pointer local_3d8;
  VertexAttribute *local_3d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_point_indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out_indices;
  size_t num_fvs;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  pointIdxRemap;
  DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData> vertex_output;
  ostringstream ss_e;
  undefined4 uStack_264;
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData> vertex_input;
  
  pvVar1 = &mesh->usdFaceVertexIndices;
  pvVar28 = &mesh->triangulatedFaceVertexIndices;
  if ((mesh->triangulatedFaceVertexIndices).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (mesh->triangulatedFaceVertexIndices).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pvVar28 = pvVar1;
  }
  memset(&vertex_input,0,0xc0);
  uVar33 = (long)(pvVar28->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar28->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  num_fvs = uVar33;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&vertex_input.point_indices,pvVar28);
  _ss_e = 0;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::_M_fill_assign
            (&vertex_input.uv0s,uVar33,(value_type *)&ss_e);
  _ss_e = 0;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::_M_fill_assign
            (&vertex_input.uv1s,uVar33,(value_type *)&ss_e);
  _ss_e = 0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&vertex_input.normals,uVar33,(value_type *)&ss_e);
  _ss_e = 0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&vertex_input.tangents,uVar33,(value_type *)&ss_e);
  _ss_e = 0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&vertex_input.binormals,uVar33,(value_type *)&ss_e);
  _ss_e = 0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (&vertex_input.colors,uVar33,(value_type *)&ss_e);
  _ss_e = _ss_e & 0xffffffff00000000;
  ::std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (&vertex_input.opacities,uVar33,(value_type_conflict1 *)&ss_e);
  this_00 = &mesh->normals;
  sVar18 = VertexAttribute::vertex_count(this_00);
  if (sVar18 != 0) {
    if ((mesh->normals).variability == FaceVarying) {
      sVar18 = VertexAttribute::vertex_count(this_00);
      if (sVar18 == uVar33) goto LAB_00282f10;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar19 = ::std::operator<<(poVar19,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar19 = ::std::operator<<(poVar19,":");
      poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
      poVar19 = ::std::operator<<(poVar19,"():");
      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0x9cf);
      ::std::operator<<(poVar19," ");
      pcVar29 = 
      "Internal error. The number of normal items does not match with the number of facevarying items."
      ;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar19 = ::std::operator<<(poVar19,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar19 = ::std::operator<<(poVar19,":");
      poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
      poVar19 = ::std::operator<<(poVar19,"():");
      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0x9ca);
      ::std::operator<<(poVar19," ");
      pcVar29 = "Internal error. normals must be \'facevarying\' variability.";
    }
    goto LAB_00283ad6;
  }
LAB_00282f10:
  this_01 = &mesh->texcoords;
  p_Var31 = &(mesh->texcoords)._M_h._M_before_begin;
  local_450 = (_Hash_node_base *)0x0;
  local_4a8 = (_Hash_node_base *)0x0;
LAB_00282f41:
  p_Var31 = p_Var31->_M_nxt;
  if (p_Var31 != (__node_base *)0x0) {
    sVar18 = VertexAttribute::vertex_count((VertexAttribute *)(p_Var31 + 2));
    if (sVar18 != 0) {
      if (*(int *)&p_Var31[0xe]._M_nxt == 4) {
        sVar18 = VertexAttribute::vertex_count((VertexAttribute *)(p_Var31 + 2));
        if (sVar18 == uVar33) {
          if ((int)*(size_type *)(p_Var31 + 1) == 1) {
            local_450 = p_Var31[8]._M_nxt;
          }
          else if ((int)*(size_type *)(p_Var31 + 1) == 0) {
            local_4a8 = p_Var31[8]._M_nxt;
          }
          goto LAB_00282f41;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar19 = ::std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                   );
        poVar19 = ::std::operator<<(poVar19,":");
        poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
        poVar19 = ::std::operator<<(poVar19,"():");
        poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0x9df);
        ::std::operator<<(poVar19," ");
        pcVar29 = 
        "Internal error. The number of texcoord items does not match with the number of facevarying items."
        ;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar19 = ::std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                   );
        poVar19 = ::std::operator<<(poVar19,":");
        poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
        poVar19 = ::std::operator<<(poVar19,"():");
        poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0x9da);
        ::std::operator<<(poVar19," ");
        pcVar29 = "Internal error. texcoords must be \'facevarying\' variability.";
      }
      poVar19 = ::std::operator<<((ostream *)&ss_e,pcVar29);
      ::std::operator<<(poVar19,"\n");
      ::std::__cxx11::stringbuf::str();
      goto LAB_00283b0f;
    }
    goto LAB_00282f41;
  }
  if (local_4a8 == (_Hash_node_base *)0x0) {
    local_490 = (unsigned_long *)0x0;
    local_488 = (pointer)0x0;
LAB_00283336:
    local_480 = &mesh->vertex_colors;
    sVar18 = VertexAttribute::vertex_count(local_480);
    if (sVar18 == 0) {
LAB_00283372:
      local_3d0 = &mesh->vertex_opacities;
      sVar18 = VertexAttribute::vertex_count(local_3d0);
      if (sVar18 == 0) {
LAB_002833ac:
        local_3e0 = (pointer)VertexAttribute::vertex_count(this_00);
        if (local_3e0 != (pointer)0x0) {
          local_3e0 = (mesh->normals).data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        local_3d8 = (pointer)VertexAttribute::vertex_count(local_480);
        if (local_3d8 != (pointer)0x0) {
          local_3d8 = (mesh->vertex_colors).data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        puVar20 = (pointer)VertexAttribute::vertex_count(local_3d0);
        if (puVar20 != (pointer)0x0) {
          puVar20 = (mesh->vertex_opacities).data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        lVar30 = 0;
        for (uVar26 = 0; uVar26 < uVar33; uVar26 = uVar26 + 1) {
          fvi = (size_t)(pvVar28->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar26];
          if (uVar33 <= fvi) {
            args_1 = local_490;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar19 = ::std::operator<<(poVar19,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                       );
            poVar19 = ::std::operator<<(poVar19,":");
            poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
            poVar19 = ::std::operator<<(poVar19,"():");
            poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa3d);
            ::std::operator<<(poVar19," ");
            ::std::__cxx11::string::string
                      ((string *)&pointIdxRemap,"Invalid faceVertexIndex {}. Must be less than {}",
                       (allocator *)&out_indices);
            fmt::format<unsigned_long,unsigned_long>
                      ((string *)&vertex_output,(fmt *)&pointIdxRemap,(string *)&fvi,&num_fvs,args_1
                      );
            poVar19 = ::std::operator<<((ostream *)&ss_e,(string *)&vertex_output);
            ::std::operator<<(poVar19,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            goto LAB_00283aed;
          }
          if (local_3e0 != (pointer)0x0) {
            *(undefined4 *)
             ((long)(vertex_input.normals.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30 + 8) =
                 *(undefined4 *)(local_3e0 + lVar30 + 8);
            *(undefined8 *)
             ((long)(vertex_input.normals.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30) =
                 *(undefined8 *)(local_3e0 + lVar30);
          }
          if (local_4a8 != (_Hash_node_base *)0x0) {
            *(_Hash_node_base **)
             vertex_input.uv0s.
             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar26]._M_elems = local_4a8[uVar26]._M_nxt;
          }
          if (local_450 != (_Hash_node_base *)0x0) {
            *(_Hash_node_base **)
             vertex_input.uv1s.
             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar26]._M_elems = local_450[uVar26]._M_nxt;
          }
          if (local_488 != (pointer)0x0) {
            *(undefined4 *)
             ((long)(vertex_input.tangents.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30 + 8) =
                 *(undefined4 *)(local_488 + lVar30 + 8);
            *(undefined8 *)
             ((long)(vertex_input.tangents.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30) =
                 *(undefined8 *)(local_488 + lVar30);
          }
          if (local_490 != (unsigned_long *)0x0) {
            *(undefined4 *)
             ((long)(vertex_input.binormals.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30 + 8) =
                 *(undefined4 *)((long)local_490 + lVar30 + 8);
            *(undefined8 *)
             ((long)(vertex_input.binormals.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30) =
                 *(undefined8 *)((long)local_490 + lVar30);
          }
          if (local_3d8 != (pointer)0x0) {
            *(undefined4 *)
             ((long)(vertex_input.colors.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30 + 8) =
                 *(undefined4 *)(local_3d8 + lVar30 + 8);
            *(undefined8 *)
             ((long)(vertex_input.colors.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30) =
                 *(undefined8 *)(local_3d8 + lVar30);
          }
          if (puVar20 != (pointer)0x0) {
            vertex_input.opacities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] = *(float *)(puVar20 + uVar26 * 4);
          }
          lVar30 = lVar30 + 0xc;
        }
        out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        memset(&vertex_output,0,0xc0);
        BuildIndices<tinyusdz::tydra::DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>,tinyusdz::tydra::DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>,tinyusdz::tydra::DefaultPackedVertexData,tinyusdz::tydra::DefaultPackedVertexDataHasher,tinyusdz::tydra::DefaultPackedVertexDataEqual>
                  (&vertex_input,&vertex_output,&out_indices,&out_point_indices);
        if ((long)out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
            (long)out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)out_point_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          pvVar28 = &mesh->triangulatedFaceVertexIndices;
          if ((mesh->triangulatedFaceVertexCounts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (mesh->triangulatedFaceVertexCounts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pvVar28 = pvVar1;
          }
          if ((mesh->triangulatedFaceVertexIndices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (mesh->triangulatedFaceVertexIndices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pvVar28 = pvVar1;
          }
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (pvVar28,&out_indices);
          _Var21 = ::std::
                   __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                             (out_indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              out_indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
          uVar2 = *_Var21._M_current;
          ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &fvi,(ulong)(uVar2 + 1),(allocator_type *)&ss_e);
          for (uVar33 = 0;
              uVar33 < (ulong)((long)out_point_indices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)out_point_indices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2);
              uVar33 = uVar33 + 1) {
            uVar26 = (ulong)out_point_indices.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar33];
            paVar5 = (mesh->points).
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(mesh->points).
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar5) / 0xc) <=
                uVar26) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar19 = ::std::operator<<(poVar19,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                         );
              poVar19 = ::std::operator<<(poVar19,":");
              poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
              poVar19 = ::std::operator<<(poVar19,"():");
              poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa7e);
              ::std::operator<<(poVar19," ");
              poVar19 = ::std::operator<<((ostream *)&ss_e,
                                          "Internal error. point index out-of-range.");
              ::std::operator<<(poVar19,"\n");
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
              ::~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               *)&fvi);
              goto LAB_00284568;
            }
            uVar3 = out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar33];
            *(float *)(fvi + 8 + (ulong)uVar3 * 0xc) = paVar5[uVar26]._M_elems[2];
            *(undefined8 *)(fvi + (ulong)uVar3 * 0xc) = *(undefined8 *)paVar5[uVar26]._M_elems;
          }
          paVar5 = (mesh->points).
                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (mesh->points).
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_418._M_allocated_capacity;
          paVar8 = (mesh->points).
                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          paVar14 = (mesh->points).
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (mesh->points).
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)fvi;
          (mesh->points).
          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = paStack_420;
          fvi = (size_t)paVar8;
          paStack_420 = paVar14;
          local_418._M_allocated_capacity = (size_type)paVar5;
          ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
          ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         *)&fvi);
          if ((mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            iVar4 = (mesh->joint_and_weights).elementSize;
            lVar30 = (long)iVar4;
            if (lVar30 < 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar19 = ::std::operator<<(poVar19,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                         );
              poVar19 = ::std::operator<<(poVar19,":");
              poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
              poVar19 = ::std::operator<<(poVar19,"():");
              poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa88);
              ::std::operator<<(poVar19," ");
              pcVar29 = "Internal error. Invalid elementSize in mesh.joint_and_weights.";
              goto LAB_00283bc8;
            }
            __n = (ulong)(uVar2 + 1) * lVar30;
            ::std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&fvi,__n,(allocator_type *)&ss_e);
            ::std::vector<float,_std::allocator<float>_>::vector
                      (&tmp_weights,__n,(allocator_type *)&ss_e);
            piVar6 = (mesh->joint_and_weights).jointIndices.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            paVar5 = (pointer)(mesh->joint_and_weights).jointIndices.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish;
            pfVar7 = (mesh->joint_and_weights).jointWeights.
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            local_498 = (_Rb_tree_node_base *)
                        (mesh->joint_and_weights).jointWeights.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
            local_3e8 = tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
            for (lVar27 = 0;
                lVar27 != (long)out_point_indices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)out_point_indices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2; lVar27 = lVar27 + 1)
            {
              sVar18 = fvi;
              piVar32 = piVar6;
              lVar34 = lVar30;
              if ((ulong)((long)paVar5 - (long)piVar6 >> 2) <=
                  (ulong)(out_point_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar27] * iVar4)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar19 = ::std::operator<<(poVar19,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar19 = ::std::operator<<(poVar19,":");
                poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
                poVar19 = ::std::operator<<(poVar19,"():");
                poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa91);
                ::std::operator<<(poVar19," ");
                pcVar29 = "Internal error. point index exceeds jointIndices.size.";
LAB_002844ff:
                poVar19 = ::std::operator<<((ostream *)&ss_e,pcVar29);
                ::std::operator<<(poVar19,"\n");
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::append((string *)&this->_err);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                          (&tmp_weights.super__Vector_base<float,_std::allocator<float>_>);
                ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&fvi);
                goto LAB_00284568;
              }
              while( true ) {
                uVar2 = out_point_indices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar27];
                bVar35 = lVar34 == 0;
                lVar34 = lVar34 + -1;
                if (bVar35) break;
                *(int *)(sVar18 + (ulong)out_indices.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar27] *
                                  lVar30 * 4) =
                     *(pointer)((long)piVar32 + (ulong)uVar2 * lVar30 * 4);
                sVar18 = sVar18 + 4;
                piVar32 = piVar32 + 1;
              }
              if ((ulong)((long)pfVar7 - (long)local_498 >> 2) <= (ulong)(iVar4 * uVar2)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar19 = ::std::operator<<(poVar19,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar19 = ::std::operator<<(poVar19,":");
                poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
                poVar19 = ::std::operator<<(poVar19,"():");
                poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa9c);
                ::std::operator<<(poVar19," ");
                pcVar29 = "Internal error. point index exceeds jointWeights.size.";
                goto LAB_002844ff;
              }
              uVar3 = out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar27];
              for (lVar34 = 0; lVar30 != lVar34; lVar34 = lVar34 + 1) {
                tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[(ulong)uVar3 * lVar30 + lVar34] =
                     (float)(&local_498->_M_color)[(ulong)uVar2 * lVar30 + lVar34];
              }
            }
            paVar8 = (pointer)(mesh->joint_and_weights).jointIndices.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
            (mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)fvi;
            (mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)paStack_420;
            (mesh->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)local_418._M_allocated_capacity;
            pfVar9 = (mesh->joint_and_weights).jointWeights.
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            (mesh->joint_and_weights).jointWeights.super__Vector_base<float,_std::allocator<float>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (mesh->joint_and_weights).jointWeights.super__Vector_base<float,_std::allocator<float>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (mesh->joint_and_weights).jointWeights.super__Vector_base<float,_std::allocator<float>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_498;
            tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = pfVar7;
            tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pfVar9;
            fvi = (size_t)piVar6;
            paStack_420 = paVar5;
            local_418._M_allocated_capacity = (size_type)paVar8;
            ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&tmp_weights.super__Vector_base<float,_std::allocator<float>_>);
            ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&fvi);
          }
          if ((mesh->targets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            pointIdxRemap._M_h._M_buckets = &pointIdxRemap._M_h._M_single_bucket;
            pointIdxRemap._M_h._M_bucket_count = 1;
            pointIdxRemap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            pointIdxRemap._M_h._M_element_count = 0;
            pointIdxRemap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            pointIdxRemap._M_h._M_rehash_policy._M_next_resize = 0;
            pointIdxRemap._M_h._M_single_bucket = (__node_base_ptr)0x0;
            lVar30 = 0;
            for (uVar33 = 0;
                uVar33 < (ulong)((long)vertex_output.point_indices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vertex_output.point_indices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar33 = uVar33 + 1) {
              pmVar22 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&pointIdxRemap,
                                     (key_type *)
                                     ((long)vertex_output.point_indices.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar30));
              _ss_e = CONCAT44(uStack_264,(int)uVar33);
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (pmVar22,(uint *)&ss_e);
              lVar30 = lVar30 + 4;
            }
            local_498 = &(mesh->targets)._M_t._M_impl.super__Rb_tree_header._M_header;
            for (p_Var24 = (mesh->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var24 != local_498;
                p_Var24 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var24)) {
              tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_408._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_408._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_408._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar33 = 0;
              while( true ) {
                puVar10 = *(pointer *)(p_Var24 + 5);
                p_Var11 = p_Var24[5]._M_parent;
                if ((ulong)((long)p_Var11 - (long)puVar10 >> 2) <= uVar33) break;
                orgPointIdx = puVar10[uVar33];
                sVar23 = ::std::
                         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::count(&pointIdxRemap._M_h,&orgPointIdx);
                if (sVar23 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar19 = ::std::operator<<(poVar19,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                             );
                  poVar19 = ::std::operator<<(poVar19,":");
                  poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
                  poVar19 = ::std::operator<<(poVar19,"():");
                  poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xabf);
                  ::std::operator<<(poVar19," ");
                  pcVar29 = "Invalid pointIndices value.";
LAB_0028437c:
                  poVar19 = ::std::operator<<((ostream *)&ss_e,pcVar29);
                  ::std::operator<<(poVar19,"\n");
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)&this->_err);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                            (&tmpPointIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                  ::std::
                  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  ~_Vector_base(&local_408);
                  ::std::
                  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 *)&tmp_weights);
                  ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable(&pointIdxRemap._M_h);
                  goto LAB_00284568;
                }
                pmVar22 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pointIdxRemap._M_h,&orgPointIdx);
                lVar30 = 0;
                for (uVar26 = 0;
                    uVar26 < (ulong)((long)(pmVar22->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pmVar22->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 2);
                    uVar26 = uVar26 + 1) {
                  lVar27 = *(long *)(p_Var24 + 6) - (long)p_Var24[5]._M_right;
                  if (lVar27 != 0) {
                    if ((ulong)(lVar27 / 0xc) <= uVar33) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar19 = ::std::operator<<(poVar19,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                                 );
                      poVar19 = ::std::operator<<(poVar19,":");
                      poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
                      poVar19 = ::std::operator<<(poVar19,"():");
                      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xac6);
                      ::std::operator<<(poVar19," ");
                      pcVar29 = "Invalid pointOffsets.size.";
                      goto LAB_0028437c;
                    }
                    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::push_back((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 *)&tmp_weights,
                                (value_type *)(&(p_Var24[5]._M_right)->_M_color + uVar33 * 3));
                  }
                  lVar27 = (long)p_Var24[6]._M_right - (long)p_Var24[6]._M_left;
                  if (lVar27 != 0) {
                    if ((ulong)(lVar27 / 0xc) <= uVar33) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar19 = ::std::operator<<(poVar19,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                                 );
                      poVar19 = ::std::operator<<(poVar19,":");
                      poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
                      poVar19 = ::std::operator<<(poVar19,"():");
                      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xacc);
                      ::std::operator<<(poVar19," ");
                      pcVar29 = "Invalid normalOffsets.size.";
                      goto LAB_0028437c;
                    }
                    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::push_back((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 *)&local_408,
                                (value_type *)(&(p_Var24[6]._M_left)->_M_color + uVar33 * 3));
                  }
                  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            (&tmpPointIndices,
                             (value_type_conflict4 *)
                             ((long)(pmVar22->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start + lVar30));
                  lVar30 = lVar30 + 4;
                }
                uVar33 = uVar33 + 1;
              }
              p_Var12 = p_Var24[5]._M_left;
              *(pointer *)(p_Var24 + 5) =
                   tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              p_Var24[5]._M_parent =
                   (_Base_ptr)
                   tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              p_Var24[5]._M_left =
                   (_Base_ptr)
                   tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              p_Var13 = p_Var24[6]._M_parent;
              p_Var24[6]._M_parent =
                   (_Base_ptr)
                   tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              p_Var15 = p_Var24[5]._M_right;
              pfVar7 = *(pointer *)(p_Var24 + 6);
              p_Var24[5]._M_right =
                   (_Base_ptr)
                   tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              *(pointer *)(p_Var24 + 6) =
                   tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              paVar5 = *(pointer *)(p_Var24 + 7);
              *(pointer *)(p_Var24 + 7) =
                   local_408._M_impl.super__Vector_impl_data._M_end_of_storage;
              p_Var16 = p_Var24[6]._M_left;
              p_Var17 = p_Var24[6]._M_right;
              p_Var24[6]._M_left = (_Base_ptr)local_408._M_impl.super__Vector_impl_data._M_start;
              p_Var24[6]._M_right = (_Base_ptr)local_408._M_impl.super__Vector_impl_data._M_finish;
              tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)p_Var15;
              tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = pfVar7;
              tmp_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)p_Var13;
              tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start = puVar10;
              tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = &p_Var11->_M_color;
              tmpPointIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = &p_Var12->_M_color;
              local_408._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var16;
              local_408._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var17;
              local_408._M_impl.super__Vector_impl_data._M_end_of_storage = paVar5;
              ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&tmpPointIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
              ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
              ::~_Vector_base(&local_408);
              ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
              ::~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               *)&tmp_weights);
            }
            ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&pointIdxRemap._M_h);
          }
          if (local_3e0 != (pointer)0x0) {
            VertexAttribute::set_buffer
                      (this_00,(uint8_t *)
                               vertex_output.normals.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       (long)vertex_output.normals.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vertex_output.normals.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            (mesh->normals).variability = Vertex;
          }
          if (local_4a8 != (_Hash_node_base *)0x0) {
            _ss_e = _ss_e & 0xffffffff00000000;
            pmVar25 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_01,(key_type *)&ss_e);
            VertexAttribute::set_buffer
                      (pmVar25,(uint8_t *)
                               vertex_output.uv0s.
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       (long)vertex_output.uv0s.
                             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vertex_output.uv0s.
                             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            _ss_e = _ss_e & 0xffffffff00000000;
            pmVar25 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_01,(key_type *)&ss_e);
            pmVar25->variability = Vertex;
          }
          if (local_450 != (_Hash_node_base *)0x0) {
            _ss_e = 1;
            pmVar25 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_01,(key_type *)&ss_e);
            VertexAttribute::set_buffer
                      (pmVar25,(uint8_t *)
                               vertex_output.uv1s.
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       (long)vertex_output.uv1s.
                             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vertex_output.uv1s.
                             super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            _ss_e = CONCAT44(uStack_264,1);
            pmVar25 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_01,(key_type *)&ss_e);
            pmVar25->variability = Vertex;
          }
          if (local_488 != (pointer)0x0) {
            VertexAttribute::set_buffer
                      (&mesh->tangents,
                       (uint8_t *)
                       vertex_output.tangents.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)vertex_output.tangents.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vertex_output.tangents.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            (mesh->tangents).variability = Vertex;
          }
          if (local_490 != (unsigned_long *)0x0) {
            VertexAttribute::set_buffer
                      (&mesh->binormals,
                       (uint8_t *)
                       vertex_output.binormals.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)vertex_output.binormals.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vertex_output.binormals.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            (mesh->binormals).variability = Vertex;
          }
          if (local_3d8 != (pointer)0x0) {
            VertexAttribute::set_buffer
                      (local_480,
                       (uint8_t *)
                       vertex_output.colors.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)vertex_output.colors.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vertex_output.colors.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
            (mesh->vertex_colors).variability = Vertex;
          }
          bVar35 = true;
          if (puVar20 != (pointer)0x0) {
            VertexAttribute::set_buffer
                      (local_3d0,
                       (uint8_t *)
                       vertex_output.opacities.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)vertex_output.opacities.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)vertex_output.opacities.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start);
            (mesh->vertex_opacities).variability = Vertex;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar19 = ::std::operator<<(poVar19,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                     );
          poVar19 = ::std::operator<<(poVar19,":");
          poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
          poVar19 = ::std::operator<<(poVar19,"():");
          poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa63);
          ::std::operator<<(poVar19," ");
          pcVar29 = "Internal error. out_indices.size != out_point_indices.";
LAB_00283bc8:
          poVar19 = ::std::operator<<((ostream *)&ss_e,pcVar29);
          ::std::operator<<(poVar19,"\n");
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)&this->_err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_00284568:
          bVar35 = false;
        }
        DefaultVertexOutput<tinyusdz::tydra::DefaultPackedVertexData>::~DefaultVertexOutput
                  (&vertex_output);
        ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&out_point_indices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&out_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        goto LAB_00283b29;
      }
      if ((mesh->vertex_opacities).variability == FaceVarying) {
        sVar18 = VertexAttribute::vertex_count(local_480);
        if (sVar18 == uVar33) goto LAB_002833ac;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar19 = ::std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                   );
        poVar19 = ::std::operator<<(poVar19,":");
        poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
        poVar19 = ::std::operator<<(poVar19,"():");
        poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa25);
        ::std::operator<<(poVar19," ");
        pcVar29 = 
        "Internal error. The number of vertex_opacity items does not match with the number of facevarying items."
        ;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar19 = ::std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                   );
        poVar19 = ::std::operator<<(poVar19,":");
        poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
        poVar19 = ::std::operator<<(poVar19,"():");
        poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa20);
        ::std::operator<<(poVar19," ");
        pcVar29 = "Internal error. vertex_opacities must be \'facevarying\' variability.";
      }
    }
    else if ((mesh->vertex_colors).variability == FaceVarying) {
      sVar18 = VertexAttribute::vertex_count(local_480);
      if (sVar18 == uVar33) goto LAB_00283372;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar19 = ::std::operator<<(poVar19,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar19 = ::std::operator<<(poVar19,":");
      poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
      poVar19 = ::std::operator<<(poVar19,"():");
      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa18);
      ::std::operator<<(poVar19," ");
      pcVar29 = 
      "Internal error. The number of vertex_color items does not match with the number of facevarying items."
      ;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar19 = ::std::operator<<(poVar19,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar19 = ::std::operator<<(poVar19,":");
      poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
      poVar19 = ::std::operator<<(poVar19,"():");
      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa13);
      ::std::operator<<(poVar19," ");
      pcVar29 = "Internal error. vertex_colors must be \'facevarying\' variability.";
    }
  }
  else {
    sVar18 = VertexAttribute::vertex_count(&mesh->tangents);
    if (sVar18 == 0) {
      local_488 = (pointer)0x0;
LAB_00283262:
      sVar18 = VertexAttribute::vertex_count(&mesh->binormals);
      if (sVar18 == 0) {
        local_490 = (unsigned_long *)0x0;
        goto LAB_00283336;
      }
      if ((mesh->binormals).variability == FaceVarying) {
        sVar18 = VertexAttribute::vertex_count(&mesh->binormals);
        if (sVar18 == uVar33) {
          local_490 = (unsigned_long *)
                      (mesh->binormals).data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          goto LAB_00283336;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar19 = ::std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                   );
        poVar19 = ::std::operator<<(poVar19,":");
        poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
        poVar19 = ::std::operator<<(poVar19,"():");
        poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa09);
        ::std::operator<<(poVar19," ");
        pcVar29 = 
        "Internal error. The number of binormals items does not match with the number of facevarying items."
        ;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar19 = ::std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                   );
        poVar19 = ::std::operator<<(poVar19,":");
        poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
        poVar19 = ::std::operator<<(poVar19,"():");
        poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0xa04);
        ::std::operator<<(poVar19," ");
        pcVar29 = "Internal error. binormals must be \'facevarying\' variability.";
      }
    }
    else if ((mesh->tangents).variability == FaceVarying) {
      sVar18 = VertexAttribute::vertex_count(&mesh->tangents);
      if (sVar18 == uVar33) {
        local_488 = (mesh->tangents).data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        goto LAB_00283262;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar19 = ::std::operator<<(poVar19,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar19 = ::std::operator<<(poVar19,":");
      poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
      poVar19 = ::std::operator<<(poVar19,"():");
      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0x9fa);
      ::std::operator<<(poVar19," ");
      pcVar29 = 
      "Internal error. The number of tangents items does not match with the number of facevarying items."
      ;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar19 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar19 = ::std::operator<<(poVar19,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar19 = ::std::operator<<(poVar19,":");
      poVar19 = ::std::operator<<(poVar19,"BuildVertexIndicesImpl");
      poVar19 = ::std::operator<<(poVar19,"():");
      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,0x9f5);
      ::std::operator<<(poVar19," ");
      pcVar29 = "Internal error. tangents must be \'facevarying\' variability.";
    }
  }
LAB_00283ad6:
  poVar19 = ::std::operator<<((ostream *)&ss_e,pcVar29);
  ::std::operator<<(poVar19,"\n");
LAB_00283aed:
  ::std::__cxx11::stringbuf::str();
LAB_00283b0f:
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  bVar35 = false;
LAB_00283b29:
  DefaultVertexInput<tinyusdz::tydra::DefaultPackedVertexData>::~DefaultVertexInput(&vertex_input);
  return bVar35;
}

Assistant:

bool RenderSceneConverter::BuildVertexIndicesImpl(RenderMesh &mesh) {
  //
  // - If mesh is triangulated, use triangulatedFaceVertexIndices, otherwise use
  // faceVertxIndices.
  // - Make vertex attributes 'facevarying' variability
  // - Assign same id for similar(currently identitical) vertex attribute.
  // - Reorder vertex attributes to 'vertex' variability.
  //

  const std::vector<uint32_t> &fvIndices =
      mesh.triangulatedFaceVertexIndices.size()
          ? mesh.triangulatedFaceVertexIndices
          : mesh.usdFaceVertexIndices;

  DefaultVertexInput<DefaultPackedVertexData> vertex_input;

  size_t num_fvs = fvIndices.size();
  vertex_input.point_indices = fvIndices;
  vertex_input.uv0s.assign(num_fvs, {0.0f, 0.0f});
  vertex_input.uv1s.assign(num_fvs, {0.0f, 0.0f});
  vertex_input.normals.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.tangents.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.binormals.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.colors.assign(num_fvs, {0.0f, 0.0f, 0.0f});
  vertex_input.opacities.assign(num_fvs, 0.0f);

  if (mesh.normals.vertex_count()) {
    if (!mesh.normals.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. normals must be 'facevarying' variability.");
    }
    if (mesh.normals.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of normal items does not match with "
          "the number of facevarying items.");
    }
  }

  const value::float2 *texcoord0_ptr = nullptr;
  const value::float2 *texcoord1_ptr = nullptr;

  for (const auto &it : mesh.texcoords) {
    if (it.second.vertex_count() > 0) {
      if (!it.second.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. texcoords must be 'facevarying' variability.");
      }
      if (it.second.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of texcoord items does not match "
            "with the number of facevarying items.");
      }

      if (it.first == 0) {
        texcoord0_ptr = reinterpret_cast<const value::float2 *>(
            it.second.get_data().data());
      } else if (it.first == 1) {
        texcoord1_ptr = reinterpret_cast<const value::float2 *>(
            it.second.get_data().data());
      } else {
        // ignore.
      }
    }
  }

  const value::float3 *tangents_ptr = nullptr;
  const value::float3 *binormals_ptr = nullptr;

  if (texcoord0_ptr) {
    if (mesh.tangents.vertex_count()) {
      if (!mesh.tangents.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. tangents must be 'facevarying' variability.");
      }
      if (mesh.tangents.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of tangents items does not match "
            "with the number of facevarying items.");
      }

      tangents_ptr = reinterpret_cast<const value::float3 *>(
          mesh.tangents.get_data().data());
    }

    if (mesh.binormals.vertex_count()) {
      if (!mesh.binormals.is_facevarying()) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. binormals must be 'facevarying' variability.");
      }
      if (mesh.binormals.vertex_count() != num_fvs) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. The number of binormals items does not match "
            "with the number of facevarying items.");
      }
      binormals_ptr = reinterpret_cast<const value::float3 *>(
          mesh.binormals.get_data().data());
    }
  }

  if (mesh.vertex_colors.vertex_count()) {
    if (!mesh.vertex_colors.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. vertex_colors must be 'facevarying' variability.");
    }
    if (mesh.vertex_colors.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of vertex_color items does not match "
          "with the number of facevarying items.");
    }
  }

  if (mesh.vertex_opacities.vertex_count()) {
    if (!mesh.vertex_opacities.is_facevarying()) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. vertex_opacities must be 'facevarying' "
          "variability.");
    }
    if (mesh.vertex_colors.vertex_count() != num_fvs) {
      PUSH_ERROR_AND_RETURN(
          "Internal error. The number of vertex_opacity items does not match "
          "with the number of facevarying items.");
    }
  }

  const value::float3 *normals_ptr =
      (mesh.normals.vertex_count() > 0)
          ? reinterpret_cast<const value::float3 *>(
                mesh.normals.get_data().data())
          : nullptr;
  const value::float3 *colors_ptr =
      (mesh.vertex_colors.vertex_count() > 0)
          ? reinterpret_cast<const value::float3 *>(
                mesh.vertex_colors.get_data().data())
          : nullptr;
  const float *opacities_ptr =
      (mesh.vertex_opacities.vertex_count() > 0)
          ? reinterpret_cast<const float *>(
                mesh.vertex_opacities.get_data().data())
          : nullptr;

  for (size_t i = 0; i < num_fvs; i++) {
    size_t fvi = fvIndices[i];
    if (fvi >= num_fvs) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Invalid faceVertexIndex {}. Must be less than {}", fvi, num_fvs));
    }

    if (normals_ptr) {
      vertex_input.normals[i] = normals_ptr[i];
    }
    if (texcoord0_ptr) {
      vertex_input.uv0s[i] = texcoord0_ptr[i];
    }
    if (texcoord1_ptr) {
      vertex_input.uv1s[i] = texcoord1_ptr[i];
    }
    if (tangents_ptr) {
      vertex_input.tangents[i] = tangents_ptr[i];
    }
    if (binormals_ptr) {
      vertex_input.binormals[i] = binormals_ptr[i];
    }
    if (colors_ptr) {
      vertex_input.colors[i] = colors_ptr[i];
    }
    if (opacities_ptr) {
      vertex_input.opacities[i] = opacities_ptr[i];
    }
  }

  std::vector<uint32_t> out_indices;
  std::vector<uint32_t> out_point_indices;  // to reorder position data
  DefaultVertexOutput<DefaultPackedVertexData> vertex_output;

  BuildIndices<DefaultVertexInput<DefaultPackedVertexData>,
               DefaultVertexOutput<DefaultPackedVertexData>,
               DefaultPackedVertexData, DefaultPackedVertexDataHasher,
               DefaultPackedVertexDataEqual>(vertex_input, vertex_output,
                                             out_indices, out_point_indices);

  if (out_indices.size() != out_point_indices.size()) {
    PUSH_ERROR_AND_RETURN(
        "Internal error. out_indices.size != out_point_indices.");
  }

  DCOUT("faceVertexIndices.size : " << fvIndices.size());
  DCOUT("# of indices after the build: "
        << out_indices.size() << ", reduced "
        << (fvIndices.size() - out_indices.size()) << " indices.");

  if (mesh.is_triangulated()) {
    mesh.triangulatedFaceVertexIndices = out_indices;
  } else {
    mesh.usdFaceVertexIndices = out_indices;
  }

  //
  // Reorder 'vertex' varying attributes(points, jointIndices/jointWeights,
  // BlendShape points, ...)
  // TODO: Preserve input order as much as possible.
  //
  {
    uint32_t numPoints =
        *std::max_element(out_indices.begin(), out_indices.end()) + 1;
    {
      std::vector<value::float3> tmp_points(numPoints);
      // TODO: Use vertex_output[i].point_index?
      for (size_t i = 0; i < out_point_indices.size(); i++) {
        if (out_point_indices[i] >= mesh.points.size()) {
          PUSH_ERROR_AND_RETURN("Internal error. point index out-of-range.");
        }
        tmp_points[out_indices[i]] = mesh.points[out_point_indices[i]];
      }
      mesh.points.swap(tmp_points);
    }

    if (mesh.joint_and_weights.jointIndices.size()) {
      if (mesh.joint_and_weights.elementSize < 1) {
        PUSH_ERROR_AND_RETURN(
            "Internal error. Invalid elementSize in mesh.joint_and_weights.");
      }
      uint32_t elementSize = uint32_t(mesh.joint_and_weights.elementSize);
      std::vector<int> tmp_indices(size_t(numPoints) * size_t(elementSize));
      std::vector<float> tmp_weights(size_t(numPoints) * size_t(elementSize));
      for (size_t i = 0; i < out_point_indices.size(); i++) {
        if ((elementSize * out_point_indices[i]) >=
            mesh.joint_and_weights.jointIndices.size()) {
          PUSH_ERROR_AND_RETURN(
              "Internal error. point index exceeds jointIndices.size.");
        }
        for (size_t k = 0; k < elementSize; k++) {
          tmp_indices[size_t(elementSize) * size_t(out_indices[i]) + k] =
              mesh.joint_and_weights
                  .jointIndices[size_t(elementSize) * size_t(out_point_indices[i]) + k];
        }

        if ((elementSize * out_point_indices[i]) >=
            mesh.joint_and_weights.jointWeights.size()) {
          PUSH_ERROR_AND_RETURN(
              "Internal error. point index exceeds jointWeights.size.");
        }

        for (size_t k = 0; k < elementSize; k++) {
          tmp_weights[size_t(elementSize) * size_t(out_indices[i]) + k] =
              mesh.joint_and_weights
                  .jointWeights[size_t(elementSize) * size_t(out_point_indices[i]) + k];
        }
      }
      mesh.joint_and_weights.jointIndices.swap(tmp_indices);
      mesh.joint_and_weights.jointWeights.swap(tmp_weights);
    }

    if (mesh.targets.size()) {
      // For BlendShape, reordering pointIndices, pointOffsets and normalOffsets is not enough.
      // Some points could be duplicated, so we need to find a mapping of org pointIdx -> pointIdx list in reordered points,
      // Then splat point attributes accordingly.

      // org pointIdx -> List of pointIdx in reordered points.
      std::unordered_map<uint32_t, std::vector<uint32_t>> pointIdxRemap;

      for (size_t i = 0; i < vertex_output.size(); i++) {
        pointIdxRemap[vertex_output.point_indices[i]].push_back(uint32_t(i));
      }

      for (auto &target : mesh.targets) {

        std::vector<value::float3> tmpPointOffsets;
        std::vector<value::float3> tmpNormalOffsets;
        std::vector<uint32_t> tmpPointIndices;

        for (size_t i = 0; i < target.second.pointIndices.size(); i++) {

          uint32_t orgPointIdx = target.second.pointIndices[i];
          if (!pointIdxRemap.count(orgPointIdx)) {
            PUSH_ERROR_AND_RETURN("Invalid pointIndices value.");
          }
          const std::vector<uint32_t> &dstPointIndices = pointIdxRemap.at(orgPointIdx);

          for (size_t k = 0; k < dstPointIndices.size(); k++) {
            if (target.second.pointOffsets.size()) {
              if (i >= target.second.pointOffsets.size()) {
                PUSH_ERROR_AND_RETURN("Invalid pointOffsets.size.");
              }
              tmpPointOffsets.push_back(target.second.pointOffsets[i]);
            }
            if (target.second.normalOffsets.size()) {
              if (i >= target.second.normalOffsets.size()) {
                PUSH_ERROR_AND_RETURN("Invalid normalOffsets.size.");
              }
              tmpNormalOffsets.push_back(target.second.normalOffsets[i]);
            }

            tmpPointIndices.push_back(dstPointIndices[k]);
          }
        }

        target.second.pointIndices.swap(tmpPointIndices);
        target.second.pointOffsets.swap(tmpPointOffsets);
        target.second.normalOffsets.swap(tmpNormalOffsets);

      }

      // TODO: Inbetween BlendShapes

    }

  }

  // Other 'facevarying' attributes are now 'vertex' variability
  if (normals_ptr) {
    mesh.normals.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.normals.data()),
        vertex_output.normals.size() * sizeof(value::float3));
    mesh.normals.variability = VertexVariability::Vertex;
  }

  if (texcoord0_ptr) {
    mesh.texcoords[0].set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.uv0s.data()),
        vertex_output.uv0s.size() * sizeof(value::float2));
    mesh.texcoords[0].variability = VertexVariability::Vertex;
  }

  if (texcoord1_ptr) {
    mesh.texcoords[1].set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.uv1s.data()),
        vertex_output.uv1s.size() * sizeof(value::float2));
    mesh.texcoords[1].variability = VertexVariability::Vertex;
  }

  if (tangents_ptr) {
    mesh.tangents.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.tangents.data()),
        vertex_output.tangents.size() * sizeof(value::float3));
    mesh.tangents.variability = VertexVariability::Vertex;
  }

  if (binormals_ptr) {
    mesh.binormals.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.binormals.data()),
        vertex_output.binormals.size() * sizeof(value::float3));
    mesh.binormals.variability = VertexVariability::Vertex;
  }

  if (colors_ptr) {
    mesh.vertex_colors.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.colors.data()),
        vertex_output.colors.size() * sizeof(value::float3));
    mesh.vertex_colors.variability = VertexVariability::Vertex;
  }

  if (opacities_ptr) {
    mesh.vertex_opacities.set_buffer(
        reinterpret_cast<const uint8_t *>(vertex_output.opacities.data()),
        vertex_output.opacities.size() * sizeof(float));
    mesh.vertex_opacities.variability = VertexVariability::Vertex;
  }

  return true;
}